

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O2

void __thiscall crnlib::dds_comp::dds_comp(dds_comp *this)

{
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__dds_comp_001b6958;
  mipmapped_texture::mipmapped_texture(&this->m_src_tex);
  mipmapped_texture::mipmapped_texture(&this->m_packed_tex);
  *(undefined8 *)&(this->m_comp_data).m_capacity = 0;
  *(undefined8 *)((long)&this->m_pParams + 4) = 0;
  (this->m_comp_data).m_p = (uchar *)0x0;
  (this->m_comp_data).m_size = 0;
  (this->m_comp_data).m_capacity = 0;
  dxt_image::pack_params::clear(&this->m_pack_params);
  task_pool::task_pool(&this->m_task_pool);
  qdxt1_params::clear(&this->m_q1_params);
  qdxt5_params::clear(&this->m_q5_params);
  this->m_pQDXT_state = (qdxt_state *)0x0;
  return;
}

Assistant:

dds_comp::dds_comp()
    : m_pParams(NULL),
      m_pixel_fmt(PIXEL_FMT_INVALID),
      m_pQDXT_state(NULL) {
}